

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageControl::mouseReleaseEvent(PageControl *this,QMouseEvent *e)

{
  QPoint QVar1;
  PageControlPrivate *this_00;
  ulong uVar2;
  QMouseEvent QVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  QPoint local_28;
  
  if (*(int *)(e + 0x40) == 1) {
    if (((this->d).d)->leftButtonPressed == true) {
      auVar8 = QEventPoint::position();
      QVar1 = ((this->d).d)->clickPos;
      iVar4 = (int)((double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar8._0_8_) - QVar1.xp;
      iVar5 = (int)((double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar8._8_8_) - QVar1.yp;
      iVar6 = iVar4 >> 0x1f;
      iVar7 = iVar5 >> 0x1f;
      uVar2 = CONCAT44(iVar5,iVar4) ^ CONCAT44(iVar7,iVar6);
      iVar4 = FingerGeometry::touchBounce();
      if (((int)(uVar2 >> 0x20) - iVar7) + ((int)uVar2 - iVar6) <= iVar4) {
        this_00 = (this->d).d;
        auVar8 = QEventPoint::position();
        local_28.xp = (int)((double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                           + auVar8._0_8_);
        local_28.yp = (int)((double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                           + auVar8._8_8_);
        iVar4 = PageControlPrivate::findButton(this_00,&local_28);
        if (-1 < iVar4) {
          setCurrentIndex(this,iVar4);
        }
      }
    }
    ((this->d).d)->leftButtonPressed = false;
    QVar3 = (QMouseEvent)0x1;
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar3;
  return;
}

Assistant:

void
PageControl::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			const QPoint pos = e->pos() - d->clickPos;

			if( pos.manhattanLength() <= FingerGeometry::touchBounce() )
			{
				const int index = d->findButton( e->pos() );

				if( index >= 0 )
					setCurrentIndex( index );
			}
		}

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}